

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::PatchInitValueNoFastPath
               (FunctionBody *functionBody,InlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,RecyclableObject *object,PropertyId propertyId,
               Var newValue)

{
  bool bVar1;
  int iVar2;
  Type *typeWithoutProperty_00;
  ScriptContext *pSVar3;
  Type *typeWithoutProperty;
  PropertyValueInfo info;
  Var newValue_local;
  PropertyId propertyId_local;
  RecyclableObject *object_local;
  InlineCacheIndex inlineCacheIndex_local;
  InlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  info._56_8_ = newValue;
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&typeWithoutProperty);
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)&typeWithoutProperty,functionBody,inlineCache,inlineCacheIndex,
             true);
  typeWithoutProperty_00 = RecyclableObject::GetType(object);
  bVar1 = ParseableFunctionInfo::IsEval(&functionBody->super_ParseableFunctionInfo);
  if ((bVar1) &&
     (iVar2 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x1b])
                        (object,(ulong)(uint)propertyId,info._56_8_,0,&typeWithoutProperty),
     iVar2 != 0)) {
    pSVar3 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    CacheOperators::CachePropertyWrite
              (object,false,typeWithoutProperty_00,propertyId,
               (PropertyValueInfo *)&typeWithoutProperty,pSVar3);
  }
  else {
    iVar2 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x1a])
                      (object,(ulong)(uint)propertyId,info._56_8_,0,&typeWithoutProperty);
    if (iVar2 != 0) {
      pSVar3 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
      CacheOperators::CachePropertyWrite
                (object,false,typeWithoutProperty_00,propertyId,
                 (PropertyValueInfo *)&typeWithoutProperty,pSVar3);
    }
  }
  return;
}

Assistant:

void JavascriptOperators::PatchInitValueNoFastPath(FunctionBody *const functionBody, InlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, RecyclableObject* object, PropertyId propertyId, Var newValue)
    {
        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, true);
        Type *typeWithoutProperty = object->GetType();

        if (functionBody->IsEval())
        {
            if (object->InitPropertyInEval(propertyId, newValue, PropertyOperation_None, &info))
            {
                CacheOperators::CachePropertyWrite(object, false, typeWithoutProperty, propertyId, &info, functionBody->GetScriptContext());
                return;
            }
        }

        if (object->InitProperty(propertyId, newValue, PropertyOperation_None, &info))
        {
            CacheOperators::CachePropertyWrite(object, false, typeWithoutProperty, propertyId, &info, functionBody->GetScriptContext());
        }
    }